

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose
          (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *this)

{
  Task *node;
  Task *ptrCopy;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *this_local;
  
  node = this->ptr;
  if (node != (Task *)0x0) {
    this->ptr = (Task *)0x0;
    kj::_::PromiseDisposer::dispose(&node->super_PromiseArenaMember);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }